

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

container_t * container_from_range(uint8_t *type,uint32_t min,uint32_t max,uint16_t step)

{
  int iVar1;
  uint size;
  array_container_t *paVar2;
  undefined6 in_register_0000000a;
  
  if ((int)CONCAT62(in_register_0000000a,step) == 1) {
    if (max < min) {
      __assert_fail("range_end >= range_start",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1131,"container_t *container_range_of_ones(uint32_t, uint32_t, uint8_t *)");
    }
    if ((max - min) + 1 < 3) {
      *type = '\x02';
      paVar2 = array_container_create_range(min,max);
      return paVar2;
    }
    *type = '\x03';
    paVar2 = (array_container_t *)run_container_create_given_capacity(1);
    if (paVar2 == (array_container_t *)0x0) {
      paVar2 = (array_container_t *)0x0;
    }
    else {
      iVar1 = paVar2->cardinality;
      *(uint32_t *)(paVar2->array + (long)iVar1 * 2) = min & 0xffff | (~min + max) * 0x10000;
      paVar2->cardinality = iVar1 + 1;
    }
  }
  else {
    size = (~min + max + (uint)step) / (uint)step;
    if ((int)size < 0x1001) {
      *type = '\x02';
      paVar2 = array_container_create_given_capacity(size);
      array_container_add_from_range(paVar2,min,max,step);
      if (paVar2->cardinality != size) {
        __assert_fail("array->cardinality == size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x114f,
                      "container_t *container_from_range(uint8_t *, uint32_t, uint32_t, uint16_t)");
      }
    }
    else {
      *type = '\x01';
      paVar2 = (array_container_t *)bitset_container_create();
      bitset_container_add_from_range((bitset_container_t *)paVar2,min,max,step);
      if (paVar2->cardinality != size) {
        __assert_fail("bitset->cardinality == size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1155,
                      "container_t *container_from_range(uint8_t *, uint32_t, uint32_t, uint16_t)");
      }
    }
  }
  return paVar2;
}

Assistant:

static inline container_t *container_from_range(
    uint8_t *type, uint32_t min,
    uint32_t max, uint16_t step
){
    if (step == 0) return NULL;  // being paranoid
    if (step == 1) {
        return container_range_of_ones(min,max,type);
        // Note: the result is not always a run (need to check the cardinality)
        //*type = RUN_CONTAINER_TYPE;
        //return run_container_create_range(min, max);
    }
    int size = (max - min + step - 1) / step;
    if (size <= DEFAULT_MAX_SIZE) {  // array container
        *type = ARRAY_CONTAINER_TYPE;
        array_container_t *array = array_container_create_given_capacity(size);
        array_container_add_from_range(array, min, max, step);
        assert(array->cardinality == size);
        return array;
    } else {  // bitset container
        *type = BITSET_CONTAINER_TYPE;
        bitset_container_t *bitset = bitset_container_create();
        bitset_container_add_from_range(bitset, min, max, step);
        assert(bitset->cardinality == size);
        return bitset;
    }
}